

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_step(sqlite3_stmt *pStmt)

{
  Mem *p;
  int *piVar1;
  long lVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  undefined2 uVar6;
  sqlite3 *db;
  sqlite3 *db_00;
  sqlite3 *db_01;
  u64 uVar7;
  Btree *p_00;
  Wal *pWVar8;
  uint *puVar9;
  long *plVar10;
  sqlite3_stmt sVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  long *plVar16;
  undefined8 *puVar17;
  short *psVar18;
  byte *pbVar19;
  size_t sVar20;
  char *pcVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  char *pcVar25;
  sqlite3_stmt *psVar26;
  undefined8 uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  Mem *pMem;
  int iVar31;
  long val;
  int iVar32;
  u32 uVar33;
  long lVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  long in_FS_OFFSET;
  bool bVar38;
  sqlite3_str local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pStmt == (sqlite3_stmt *)0x0) {
    pcVar21 = "API called with NULL prepared statement";
  }
  else {
    db = *(sqlite3 **)pStmt;
    if (db != (sqlite3 *)0x0) {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      iVar35 = 0;
LAB_001218ed:
      db_00 = *(sqlite3 **)pStmt;
      sVar11 = pStmt[199];
      if (sVar11 == (sqlite3_stmt)0x2) {
LAB_001219e8:
        if ((*(ushort *)(pStmt + 200) & 0xc) != 0) {
          db_01 = *(sqlite3 **)pStmt;
          lVar29 = *(long *)(pStmt + 0x68);
          p = (Mem *)(lVar29 + 0x38);
          if ((*(ushort *)(pStmt + 200) & 0xc) == 4) {
            releaseMemArray(p,8);
            if (*(int *)(pStmt + 0x34) == 7) {
LAB_00121a71:
              sqlite3OomFault(db_01);
LAB_00121a7b:
              uVar13 = 1;
              uVar36 = 1;
              goto LAB_00121c86;
            }
LAB_00121aa2:
            lVar34 = *(long *)(pStmt + 0x68);
            pMem = (Mem *)(lVar34 + 0x1f8);
            uVar5 = *(ushort *)(pStmt + 200);
            iVar32 = *(int *)(pStmt + 0x90);
            if ((*(byte *)(lVar34 + 0x20c) & 0x10) == 0) {
              bVar38 = false;
              goto LAB_00121ac8;
            }
            uVar13 = *(int *)(lVar34 + 0x208) >> 3;
            uVar37 = (ulong)uVar13;
            plVar16 = *(long **)(lVar34 + 0x200);
            if (0 < (int)uVar13) {
              uVar24 = 0;
              do {
                iVar32 = iVar32 + *(int *)(plVar16[uVar24] + 8);
                uVar24 = uVar24 + 1;
              } while (uVar37 != uVar24);
            }
            bVar38 = false;
          }
          else {
            uVar7 = db_01->flags;
            releaseMemArray(p,8);
            if (*(int *)(pStmt + 0x34) == 7) goto LAB_00121a71;
            if (((uint)uVar7 >> 0x18 & 1) != 0) goto LAB_00121aa2;
            uVar5 = *(ushort *)(pStmt + 200);
            iVar32 = *(int *)(pStmt + 0x90);
            pMem = (Mem *)0x0;
            bVar38 = true;
LAB_00121ac8:
            uVar37 = 0;
            plVar16 = (long *)0x0;
          }
          iVar14 = *(int *)(pStmt + 0x30);
          iVar22 = iVar14 + 1;
          iVar23 = iVar22;
          if (iVar32 <= iVar14) {
LAB_00121c6d:
            *(undefined4 *)(pStmt + 0x34) = 0;
            uVar36 = 0x65;
            uVar13 = 0x65;
            iVar28 = iVar23;
LAB_00121c7d:
            *(int *)(pStmt + 0x30) = iVar28;
            goto LAB_00121c86;
          }
LAB_00121b20:
          iVar28 = iVar23;
          iVar31 = iVar14 - *(int *)(pStmt + 0x90);
          psVar26 = pStmt + 0x88;
          iVar23 = iVar14;
          if (*(int *)(pStmt + 0x90) <= iVar14) {
            psVar26 = (sqlite3_stmt *)*plVar16;
            iVar30 = *(int *)(psVar26 + 8);
            iVar23 = iVar31;
            plVar10 = plVar16;
            if (iVar30 <= iVar31) {
              do {
                iVar31 = iVar31 - iVar30;
                psVar26 = (sqlite3_stmt *)plVar10[1];
                iVar30 = *(int *)(psVar26 + 8);
                iVar23 = iVar31;
                plVar10 = plVar10 + 1;
              } while (iVar30 <= iVar31);
            }
          }
          lVar34 = *(long *)psVar26;
          val = (long)iVar23;
          if ((!bVar38) && (*(char *)(lVar34 + 1 + val * 0x18) == -4)) {
            lVar2 = lVar34 + val * 0x18;
            iVar23 = (int)uVar37;
            if (iVar23 < 1) {
              uVar24 = 0;
LAB_00121ba3:
              if ((int)uVar24 != iVar23) goto LAB_00121c37;
            }
            else {
              uVar24 = 0;
              do {
                if (plVar16[uVar24] == *(long *)(lVar2 + 0x10)) goto LAB_00121ba3;
                uVar24 = uVar24 + 1;
              } while (uVar37 != uVar24);
            }
            iVar30 = iVar23 * 8 + 8;
            iVar31 = sqlite3VdbeMemGrow(pMem,iVar30,(uint)(iVar23 != 0));
            *(int *)(pStmt + 0x34) = iVar31;
            if (iVar31 != 0) {
              uVar36 = 1;
              uVar13 = 1;
              goto LAB_00121c7d;
            }
            plVar16 = (long *)pMem->z;
            uVar37 = (ulong)(iVar23 + 1);
            plVar16[iVar23] = *(long *)(lVar2 + 0x10);
            uVar6 = pMem->flags;
            pMem->flags = uVar6 & 0xf240 | 0x10;
            pMem->n = iVar30;
            iVar32 = iVar32 + *(int *)(*(long *)(lVar2 + 0x10) + 8);
          }
LAB_00121c37:
          iVar23 = iVar22;
          if ((((uVar5 & 0xc) == 8) &&
              (cVar12 = *(char *)(lVar34 + val * 0x18), iVar23 = iVar28, cVar12 != -0x44)) &&
             ((iVar14 < 1 || (cVar12 != '\b')))) goto LAB_00121c61;
          *(int *)(pStmt + 0x30) = iVar23;
          if ((db_01->u1).isInterrupted != 0) {
            *(undefined4 *)(pStmt + 0x34) = 9;
            sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
            goto LAB_00121a7b;
          }
          pbVar3 = (byte *)(lVar34 + val * 0x18);
          local_58.nChar = 0;
          local_58.accError = '\0';
          local_58.printfFlags = '\0';
          local_58._30_2_ = 0xaaaa;
          local_58.db = (sqlite3 *)0x0;
          local_58.zText = (char *)0x0;
          local_58.nAlloc = 0;
          local_58.mxAlloc = 1000000000;
          pcVar21 = "program";
          switch(pbVar3[1]) {
          case 0xef:
            sqlite3_str_appendf(&local_58,"subrtnsig:%d,%s",(ulong)**(uint **)(pbVar3 + 0x10),
                                *(undefined8 *)(*(uint **)(pbVar3 + 0x10) + 2));
            goto LAB_001221bb;
          default:
            pbVar19 = pbVar3 + 0x10;
            goto LAB_00122179;
          case 0xf1:
            psVar18 = *(short **)(*(long *)(pbVar3 + 0x10) + 8);
            goto LAB_00122071;
          case 0xf2:
            puVar9 = *(uint **)(pbVar3 + 0x10);
            uVar13 = *puVar9;
            if (uVar13 != 0) {
              uVar36 = 1;
              do {
                uVar27 = 0x2c;
                if (uVar36 == 1) {
                  uVar27 = 0x5b;
                }
                sqlite3_str_appendf(&local_58,"%c%u",uVar27,(ulong)puVar9[uVar36]);
                uVar36 = uVar36 + 1;
              } while (uVar36 <= uVar13);
              uVar37 = local_58._24_8_ & 0xffffffff;
              if (local_58.nChar + 1 < local_58.nAlloc) {
                local_58.nChar = local_58.nChar + 1;
                local_58.zText[uVar37] = ']';
                goto LAB_001221bb;
              }
            }
            enlargeAndAppend(&local_58,"]",1);
            goto LAB_001221bb;
          case 0xf3:
            puVar17 = *(undefined8 **)(pbVar3 + 0x10);
LAB_00122054:
            uVar27 = *puVar17;
            pcVar21 = "%lld";
            goto LAB_00122061;
          case 0xf4:
            puVar17 = *(undefined8 **)(pbVar3 + 0x10);
LAB_00121f59:
            sqlite3_str_appendf(&local_58,"%.16g",(int)*puVar17);
            goto LAB_001221bb;
          case 0xf5:
            uVar27 = *(undefined8 *)(*(long *)(pbVar3 + 0x10) + 0x10);
            pcVar21 = "vtab:%p";
LAB_00122061:
            sqlite3_str_appendf(&local_58,pcVar21,uVar27);
            goto LAB_001221bb;
          case 0xf6:
            puVar17 = *(undefined8 **)(pbVar3 + 0x10);
            uVar5 = *(ushort *)((long)puVar17 + 0x14);
            if ((uVar5 & 2) != 0) {
              pbVar19 = (byte *)(puVar17 + 1);
              goto LAB_00122179;
            }
            if ((uVar5 & 0x24) != 0) goto LAB_00122054;
            if ((uVar5 & 8) != 0) goto LAB_00121f59;
            pcVar21 = "NULL";
            if ((uVar5 & 1) == 0) {
              pcVar21 = "(blob)";
            }
            break;
          case 0xf8:
            lVar34 = *(long *)(pbVar3 + 0x10);
            sqlite3_str_appendf(&local_58,"k(%d",(ulong)*(ushort *)(lVar34 + 6));
            if (*(short *)(lVar34 + 6) != 0) {
              uVar37 = 0;
              do {
                puVar17 = *(undefined8 **)(lVar34 + 0x20 + uVar37 * 8);
                pcVar21 = "";
                if (puVar17 != (undefined8 *)0x0) {
                  pcVar21 = (char *)*puVar17;
                }
                strcmp(pcVar21,"BINARY");
                bVar4 = *(byte *)(*(long *)(lVar34 + 0x18) + uVar37);
                pcVar21 = "-";
                if ((bVar4 & 1) == 0) {
                  pcVar21 = "";
                }
                pcVar25 = "N.";
                if ((bVar4 & 2) == 0) {
                  pcVar25 = "";
                }
                sqlite3_str_appendf(&local_58,",%s%s%s",pcVar21,pcVar25);
                uVar37 = uVar37 + 1;
              } while (uVar37 < *(ushort *)(lVar34 + 6));
            }
            uVar37 = local_58._24_8_ & 0xffffffff;
            if (local_58.nChar + 1 < local_58.nAlloc) {
              local_58.nChar = local_58.nChar + 1;
              local_58.zText[uVar37] = ')';
            }
            else {
              enlargeAndAppend(&local_58,")",1);
            }
LAB_001221bb:
            if ((local_58._24_8_ & 0x700000000) != 0) {
              sqlite3OomFault(db_01);
            }
            pcVar21 = sqlite3StrAccumFinish(&local_58);
            if ((*(ushort *)(pStmt + 200) & 0xc) == 8) {
              if ((*(byte *)(lVar29 + 0x4d) & 0x90) == 0) {
                *(long *)(lVar29 + 0x38) = (long)*(int *)(pbVar3 + 4);
                *(undefined2 *)(lVar29 + 0x4c) = 4;
              }
              else {
                vdbeReleaseAndSetInt64(p,(long)*(int *)(pbVar3 + 4));
              }
              if ((*(byte *)(lVar29 + 0x85) & 0x90) == 0) {
                *(long *)(lVar29 + 0x70) = (long)*(int *)(pbVar3 + 8);
                *(undefined2 *)(lVar29 + 0x84) = 4;
              }
              else {
                vdbeReleaseAndSetInt64((Mem *)(lVar29 + 0x70),(long)*(int *)(pbVar3 + 8));
              }
              if ((*(byte *)(lVar29 + 0xbd) & 0x90) == 0) {
                *(long *)(lVar29 + 0xa8) = (long)*(int *)(pbVar3 + 0xc);
                *(undefined2 *)(lVar29 + 0xbc) = 4;
              }
              else {
                vdbeReleaseAndSetInt64((Mem *)(lVar29 + 0xa8),(long)*(int *)(pbVar3 + 0xc));
              }
              lVar34 = 0xe0;
            }
            else {
              if ((*(byte *)(lVar29 + 0x4d) & 0x90) == 0) {
                *(long *)(lVar29 + 0x38) = val;
                *(undefined2 *)(lVar29 + 0x4c) = 4;
              }
              else {
                vdbeReleaseAndSetInt64(p,val);
              }
              sqlite3VdbeMemSetStr
                        ((Mem *)(lVar29 + 0x70),
                         sqlite3OpcodeName_azName_rel +
                         *(int *)(sqlite3OpcodeName_azName_rel + (ulong)*pbVar3 * 4),-1,'\x01',
                         (_func_void_void_ptr *)0x0);
              if ((*(byte *)(lVar29 + 0xbd) & 0x90) == 0) {
                *(long *)(lVar29 + 0xa8) = (long)*(int *)(pbVar3 + 4);
                *(undefined2 *)(lVar29 + 0xbc) = 4;
              }
              else {
                vdbeReleaseAndSetInt64((Mem *)(lVar29 + 0xa8),(long)*(int *)(pbVar3 + 4));
              }
              if ((*(byte *)(lVar29 + 0xf5) & 0x90) == 0) {
                *(long *)(lVar29 + 0xe0) = (long)*(int *)(pbVar3 + 8);
                *(undefined2 *)(lVar29 + 0xf4) = 4;
              }
              else {
                vdbeReleaseAndSetInt64((Mem *)(lVar29 + 0xe0),(long)*(int *)(pbVar3 + 8));
              }
              if ((*(byte *)(lVar29 + 0x12d) & 0x90) == 0) {
                *(long *)(lVar29 + 0x118) = (long)*(int *)(pbVar3 + 0xc);
                *(undefined2 *)(lVar29 + 300) = 4;
              }
              else {
                vdbeReleaseAndSetInt64((Mem *)(lVar29 + 0x118),(long)*(int *)(pbVar3 + 0xc));
              }
              if ((*(byte *)(lVar29 + 0x19d) & 0x90) == 0) {
                *(ulong *)(lVar29 + 0x188) = (ulong)*(ushort *)(pbVar3 + 2);
                *(undefined2 *)(lVar29 + 0x19c) = 4;
              }
              else {
                vdbeReleaseAndSetInt64((Mem *)(lVar29 + 0x188),(ulong)*(ushort *)(pbVar3 + 2));
              }
              if ((*(byte *)(lVar29 + 0x1d5) & 0x90) == 0) {
                *(undefined2 *)(lVar29 + 0x1d4) = 1;
              }
              else {
                vdbeMemClearExternAndSetNull((Mem *)(lVar29 + 0x1c0));
              }
              lVar34 = 0x150;
            }
            uVar13 = 1;
            sqlite3VdbeMemSetStr((Mem *)(lVar29 + lVar34),pcVar21,-1,'\x01',sqlite3_free);
            *(Mem **)(pStmt + 0xa0) = p;
            bVar38 = db_01->mallocFailed == '\0';
            uVar15 = 7;
            if (bVar38) {
              uVar15 = 0;
            }
            *(undefined4 *)(pStmt + 0x34) = uVar15;
            uVar36 = 1;
            if (bVar38) goto LAB_001224bd;
            goto LAB_00121c86;
          case 0xf9:
            psVar18 = *(short **)(pbVar3 + 0x10);
LAB_00122071:
            sqlite3_str_appendf(&local_58,"%s(%d)",*(undefined8 *)(psVar18 + 0x1c),
                                (ulong)(uint)(int)*psVar18);
            goto LAB_001221bb;
          case 0xfb:
            pbVar19 = *(byte **)(pbVar3 + 0x10);
LAB_00122179:
            pcVar21 = *(char **)pbVar19;
            if (pcVar21 == (char *)0x0) goto LAB_001221bb;
            break;
          case 0xfc:
            break;
          case 0xfd:
            sqlite3_str_appendf(&local_58,"%d",(ulong)*(uint *)(pbVar3 + 0x10));
            goto LAB_001221bb;
          case 0xfe:
            sqlite3_str_appendf(&local_58,"%.18s-%s",**(undefined8 **)(pbVar3 + 0x10),
                                sqlite3VdbeDisplayP4_encnames_rel +
                                *(int *)(sqlite3VdbeDisplayP4_encnames_rel +
                                        (ulong)*(byte *)(*(undefined8 **)(pbVar3 + 0x10) + 1) * 4));
            goto LAB_001221bb;
          }
          sVar20 = strlen(pcVar21);
          sqlite3_str_append(&local_58,pcVar21,(uint)sVar20 & 0x3fffffff);
          goto LAB_001221bb;
        }
        db_00->nVdbeExec = db_00->nVdbeExec + 1;
        uVar13 = sqlite3VdbeExec((Vdbe *)pStmt);
        db_00->nVdbeExec = db_00->nVdbeExec + -1;
        uVar36 = uVar13;
        if (uVar13 != 100) {
LAB_00121c86:
          if (0 < *(long *)(pStmt + 0xb8)) {
            invokeProfileCallback(db_00,(Vdbe *)pStmt);
          }
          *(undefined8 *)(pStmt + 0xa0) = 0;
          if (uVar13 == 0x65) {
            uVar13 = 0x65;
            uVar36 = 0x65;
            if (db_00->autoCommit != '\0') {
              if (db_00->nDb < 1) {
                *(undefined4 *)(pStmt + 0x34) = 0;
              }
              else {
                lVar34 = 0;
                lVar29 = 0;
                iVar32 = 0;
                do {
                  p_00 = *(Btree **)((long)&db_00->aDb->pBt + lVar34);
                  if (p_00 != (Btree *)0x0) {
                    if ((p_00->sharable != '\0') &&
                       (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
                      btreeLockCarefully(p_00);
                    }
                    pWVar8 = p_00->pBt->pPager->pWal;
                    if (pWVar8 == (Wal *)0x0) {
                      uVar33 = 0;
                    }
                    else {
                      uVar33 = pWVar8->iCallback;
                      pWVar8->iCallback = 0;
                    }
                    if (p_00->sharable != '\0') {
                      piVar1 = &p_00->wantToLock;
                      *piVar1 = *piVar1 + -1;
                      if (*piVar1 == 0) {
                        unlockBtreeMutex(p_00);
                      }
                    }
                    if (((0 < (int)uVar33) &&
                        (db_00->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0))
                       && (iVar32 == 0)) {
                      iVar32 = (*db_00->xWalCallback)
                                         (db_00->pWalArg,db_00,
                                          *(char **)((long)&db_00->aDb->zDbSName + lVar34),uVar33);
                    }
                  }
                  lVar29 = lVar29 + 1;
                  lVar34 = lVar34 + 0x20;
                } while (lVar29 < db_00->nDb);
                *(int *)(pStmt + 0x34) = iVar32;
                uVar13 = 1;
                uVar36 = 1;
                if (iVar32 != 0) goto LAB_00121dbf;
              }
              uVar13 = 0x65;
              uVar36 = 0x65;
            }
          }
          else if ((char)pStmt[0xc6] < '\0') {
            uVar13 = sqlite3VdbeTransferError((Vdbe *)pStmt);
            uVar36 = uVar13;
          }
LAB_00121dbf:
          db_00->errCode = uVar13;
          if (((*(int *)(pStmt + 0x34) != 0) || ((*(sqlite3 **)pStmt)->mallocFailed != '\0')) &&
             ((iVar32 = apiHandleError(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x34)), iVar32 == 7 &&
              (*(undefined4 *)(pStmt + 0x34) = 7, uVar13 = uVar36, (char)pStmt[0xc6] < '\0')))) {
            uVar13 = 7;
          }
          goto LAB_00121df4;
        }
LAB_001224bd:
        db_00->errCode = 100;
        uVar13 = 100;
      }
      else {
        while (sVar11 == (sqlite3_stmt)0x3) {
          sqlite3_reset(pStmt);
          sVar11 = pStmt[199];
        }
        if (sVar11 != (sqlite3_stmt)0x1) goto LAB_001219e8;
        if (((byte)pStmt[200] & 3) == 0) {
          iVar32 = db_00->nVdbeActive;
          if (iVar32 == 0) {
            (db_00->u1).isInterrupted = 0;
          }
          if ((((db_00->mTrace & 0x82) != 0) && ((db_00->init).busy == '\0')) &&
             (*(long *)(pStmt + 0xf8) != 0)) {
            sqlite3OsCurrentTimeInt64(db_00->pVfs,(sqlite3_int64 *)(pStmt + 0xb8));
            iVar32 = db_00->nVdbeActive;
          }
          db_00->nVdbeActive = iVar32 + 1;
          cVar12 = (char)*(ushort *)(pStmt + 200);
          if ((*(ushort *)(pStmt + 200) & 0x40) == 0) {
            db_00->nVdbeWrite = db_00->nVdbeWrite + 1;
            cVar12 = (char)*(undefined2 *)(pStmt + 200);
          }
          if (cVar12 < '\0') {
            db_00->nVdbeRead = db_00->nVdbeRead + 1;
          }
          *(undefined4 *)(pStmt + 0x30) = 0;
          pStmt[199] = (sqlite3_stmt)0x2;
          goto LAB_001219e8;
        }
        *(undefined4 *)(pStmt + 0x34) = 0x11;
        uVar13 = 1;
        if ((char)pStmt[0xc6] < '\0') {
          uVar13 = sqlite3VdbeTransferError((Vdbe *)pStmt);
        }
LAB_00121df4:
        uVar13 = uVar13 & db_00->errMask;
        if (uVar13 == 0x11) {
          if (iVar35 == 0x32) {
            uVar13 = 0x11;
          }
          else {
            iVar32 = *(int *)(pStmt + 0x30);
            iVar14 = sqlite3Reprepare((Vdbe *)pStmt);
            if (iVar14 == 0) goto code_r0x00121e26;
            pcVar21 = (char *)sqlite3ValueText(db->pErr,'\x01');
            if (*(void **)(pStmt + 0xa8) != (void *)0x0) {
              sqlite3DbFreeNN(db,*(void **)(pStmt + 0xa8));
            }
            if (db->mallocFailed == '\0') {
              pcVar21 = sqlite3DbStrDup(db,pcVar21);
              *(char **)(pStmt + 0xa8) = pcVar21;
              uVar13 = apiHandleError(db,iVar14);
              *(uint *)(pStmt + 0x34) = uVar13;
            }
            else {
              *(undefined8 *)(pStmt + 0xa8) = 0;
              *(undefined4 *)(pStmt + 0x34) = 7;
              uVar13 = 7;
            }
          }
        }
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
      goto LAB_00122505;
    }
    pcVar21 = "API called with finalized prepared statement";
  }
  uVar13 = 0x15;
  sqlite3_log(0x15,pcVar21);
  sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x165a9,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
LAB_00122505:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar13;
  }
  __stack_chk_fail();
LAB_00121c61:
  iVar23 = iVar28 + 1;
  iVar14 = iVar28;
  if (iVar32 <= iVar28) goto LAB_00121c6d;
  goto LAB_00121b20;
code_r0x00121e26:
  iVar35 = iVar35 + 1;
  sqlite3_reset(pStmt);
  if (-1 < iVar32) {
    pStmt[0xc5] = (sqlite3_stmt)0xfe;
  }
  goto LAB_001218ed;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}